

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O3

int log_aspect_destroy(log_aspect aspect)

{
  uint uVar1;
  uint uVar2;
  log_policy *__ptr;
  ulong uVar3;
  
  if (aspect == (log_aspect)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (*aspect->iface->destroy)(aspect);
    __ptr = aspect->policies;
    if (__ptr != (log_policy *)0x0) {
      if (aspect->count != 0) {
        uVar3 = 0;
        do {
          uVar2 = log_policy_destroy(aspect->policies[uVar3]);
          uVar1 = uVar1 | uVar2;
          uVar3 = uVar3 + 1;
        } while (uVar3 < aspect->count);
        __ptr = aspect->policies;
      }
      free(__ptr);
    }
    free(aspect);
  }
  return uVar1;
}

Assistant:

int log_aspect_destroy(log_aspect aspect)
{
	if (aspect != NULL)
	{
		int result = aspect->iface->destroy(aspect);

		if (aspect->policies)
		{
			size_t iterator;

			for (iterator = 0; iterator < aspect->count; ++iterator)
			{
				result |= log_policy_destroy(aspect->policies[iterator]);
			}

			free(aspect->policies);
		}

		free(aspect);

		return result;
	}

	return 0;
}